

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O3

void __thiscall
Diligent::DescriptorSetAllocator::FreeDescriptorSet
          (DescriptorSetAllocator *this,VkDescriptorSet Set,VkDescriptorPool Pool,Uint64 QueueMask)

{
  RenderDeviceVkImpl *pRVar1;
  CommandQueue *pCVar2;
  byte bVar3;
  ulong uVar4;
  VkDescriptorPool Args_1;
  ulong uVar5;
  _func_int **pp_Var6;
  string msg;
  string local_78;
  DescriptorSetDeleter local_58;
  VkDescriptorPool local_40;
  DynamicStaleResourceWrapper local_38;
  
  pRVar1 = (this->super_DescriptorPoolManager).m_DeviceVkImpl;
  local_58.Allocator = this;
  local_58.Set = Set;
  local_58.Pool = Pool;
  local_40 = Pool;
  if ((pRVar1->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CommandQueues == (CommandQueue *)0x0) {
    FormatString<char[99]>
              (&local_78,
               (char (*) [99])
               "Command queues have been destroyed. Are you releasing an object from the render device destructor?"
              );
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  uVar4 = (pRVar1->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount;
  uVar5 = ~(-1L << ((byte)uVar4 & 0x3f));
  if (0x3f < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar5 = uVar5 & QueueMask;
  if (uVar5 == 0) {
    FormatString<char[57]>
              (&local_78,(char (*) [57])"At least one bit should be set in the command queue mask");
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6f);
  }
  else {
    uVar4 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    pp_Var6 = (_func_int **)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
    ;
    if (pp_Var6 == (_func_int **)0x1) {
      local_38.m_pStaleResource = (StaleResourceBase *)operator_new(0x20);
      (local_38.m_pStaleResource)->_vptr_StaleResourceBase =
           (_func_int **)&PTR__SpecificStaleResource_00aeffe8;
      local_38.m_pStaleResource[1]._vptr_StaleResourceBase = (_func_int **)this;
      local_38.m_pStaleResource[2]._vptr_StaleResourceBase = (_func_int **)Set;
      local_38.m_pStaleResource[3]._vptr_StaleResourceBase = (_func_int **)local_40;
    }
    else {
      local_38.m_pStaleResource = (StaleResourceBase *)operator_new(0x28);
      (local_38.m_pStaleResource)->_vptr_StaleResourceBase =
           (_func_int **)&PTR__SpecificSharedStaleResource_00af0028;
      local_38.m_pStaleResource[1]._vptr_StaleResourceBase = (_func_int **)this;
      local_38.m_pStaleResource[2]._vptr_StaleResourceBase = (_func_int **)Set;
      local_38.m_pStaleResource[3]._vptr_StaleResourceBase = (_func_int **)local_40;
      local_38.m_pStaleResource[4]._vptr_StaleResourceBase = pp_Var6;
    }
    local_58.Pool = (VkDescriptorPool)0x0;
    local_58.Set = (VkDescriptorSet)0x0;
    local_58.Allocator = (DescriptorSetAllocator *)0x0;
    Args_1 = local_40;
    do {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if ((pRVar1->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount <= uVar4) {
        FormatString<char[26],char[27]>
                  (&local_78,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x7fb2bd,
                   (char (*) [27])Args_1);
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"SafeReleaseDeviceObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x7a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      pCVar2 = (pRVar1->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).m_CommandQueues;
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
                (&pCVar2[uVar4].ReleaseQueue,&local_38,
                 pCVar2[uVar4].NextCmdBufferNumber.super___atomic_base<unsigned_long>._M_i);
      Args_1 = (VkDescriptorPool)(uVar4 & 0xffffffff);
      bVar3 = (byte)Args_1 & 0x3f;
      pp_Var6 = (_func_int **)((long)pp_Var6 - 1);
      uVar5 = uVar5 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    } while (uVar5 != 0);
    if (pp_Var6 == (_func_int **)0x0) goto LAB_00282c13;
    FormatString<char[26],char[19]>
              (&local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumReferences == 0",(char (*) [19])Args_1);
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x82);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_00282c13:
  FreeDescriptorSet::DescriptorSetDeleter::~DescriptorSetDeleter(&local_58);
  return;
}

Assistant:

void DescriptorSetAllocator::FreeDescriptorSet(VkDescriptorSet Set, VkDescriptorPool Pool, Uint64 QueueMask)
{
    class DescriptorSetDeleter
    {
    public:
        // clang-format off
        DescriptorSetDeleter(DescriptorSetAllocator& _Allocator,
                             VkDescriptorSet         _Set,
                             VkDescriptorPool        _Pool) :
            Allocator {&_Allocator},
            Set       {_Set       },
            Pool      {_Pool      }
        {}

        DescriptorSetDeleter             (const DescriptorSetDeleter&) = delete;
        DescriptorSetDeleter& operator = (const DescriptorSetDeleter&) = delete;
        DescriptorSetDeleter& operator = (      DescriptorSetDeleter&&)= delete;

        DescriptorSetDeleter(DescriptorSetDeleter&& rhs)noexcept :
            Allocator {rhs.Allocator},
            Set       {rhs.Set      },
            Pool      {rhs.Pool     }
        {
            rhs.Allocator = nullptr;
            rhs.Set       = VK_NULL_HANDLE;
            rhs.Pool      = VK_NULL_HANDLE;
        }
        // clang-format on

        ~DescriptorSetDeleter()
        {
            if (Allocator != nullptr)
            {
                std::lock_guard<std::mutex> Lock{Allocator->m_Mutex};
                Allocator->m_DeviceVkImpl.GetLogicalDevice().FreeDescriptorSet(Pool, Set);
#ifdef DILIGENT_DEVELOPMENT
                --Allocator->m_AllocatedSetCounter;
#endif
            }
        }

    private:
        DescriptorSetAllocator* Allocator;
        VkDescriptorSet         Set;
        VkDescriptorPool        Pool;
    };
    m_DeviceVkImpl.SafeReleaseDeviceObject(DescriptorSetDeleter{*this, Set, Pool}, QueueMask);
}